

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall
World::World(World *this,
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
            *dbinfo,Config *eoserv_config,Config *admin_config)

{
  Timer *this_00;
  Config *this_01;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer puVar2;
  __uniq_ptr_impl<NPC_Data,_std::default_delete<NPC_Data>_> this_02;
  pointer pEVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  EIF *this_03;
  ENF *this_04;
  ESF *this_05;
  ECF *this_06;
  size_type __new_size;
  NPC_Data *this_07;
  Map *this_08;
  TimeEvent *pTVar9;
  Board *pBVar10;
  GuildManager *this_09;
  short sVar11;
  uint uVar12;
  Engine type;
  size_type sVar13;
  size_t i;
  long lVar14;
  pointer pEVar15;
  double dVar16;
  shared_ptr<Quest> q;
  ENF_Data_Base<ENF> npc;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<Map_*,_std::allocator<Map_*>_> *local_c8;
  Config *local_c0;
  Config *local_b8;
  Config *local_b0;
  Config *local_a8;
  Config *local_a0;
  Config *local_98;
  Database *local_90;
  Config *local_88;
  _Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest>>>>
  *local_80;
  string dbdesc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->timer;
  Timer::Timer(this_00);
  local_90 = &this->db;
  Database::Database(local_90);
  (this->npc_data).
  super__Vector_base<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->npc_data).
  super__Vector_base<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->npc_data).
  super__Vector_base<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = &this->config;
  Config::Config(this_01);
  local_88 = &this->admin_config;
  Config::Config(local_88);
  local_98 = &this->drops_config;
  Config::Config(local_98);
  local_a0 = &this->shops_config;
  Config::Config(local_a0);
  local_a8 = &this->arenas_config;
  Config::Config(local_a8);
  local_b0 = &this->formulas_config;
  Config::Config(local_b0);
  local_b8 = &this->home_config;
  Config::Config(local_b8);
  local_c0 = &this->skills_config;
  Config::Config(local_c0);
  (this->formulas_cache)._M_h._M_buckets = &(this->formulas_cache)._M_h._M_single_bucket;
  (this->formulas_cache)._M_h._M_bucket_count = 1;
  (this->formulas_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->formulas_cache)._M_h._M_element_count = 0;
  (this->formulas_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->formulas_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->formulas_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dbdesc,"ServerLanguage",(allocator<char> *)&q);
  cVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)eoserv_config,&dbdesc);
  util::variant::GetString_abi_cxx11_
            ((string *)&npc,
             (variant *)
             ((long)cVar7.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                    ._M_cur + 0x28));
  I18N::I18N(&this->i18n,(string *)&npc);
  std::__cxx11::string::~string((string *)&npc);
  std::__cxx11::string::~string((string *)&dbdesc);
  local_c8 = &this->maps;
  p_Var1 = &(this->quests)._M_t._M_impl.super__Rb_tree_header;
  (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parties).super__Vector_base<Party_*,_std::allocator<Party_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parties).super__Vector_base<Party_*,_std::allocator<Party_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parties).super__Vector_base<Party_*,_std::allocator<Party_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->quests)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->instrument_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->instrument_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->instrument_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->instrument_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_80 = (_Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest>>>>
              *)&this->quests;
  if ((int)((this->timer).resolution * 1000.0) < 2) {
    Console::Out("Timers set at < 1 ms resolution");
  }
  else {
    Console::Out("Timers set at approx. %i ms resolution");
  }
  Config::operator=(this_01,eoserv_config);
  Config::operator=(local_88,admin_config);
  dbdesc._M_dataplus._M_p = (pointer)&dbdesc.field_2;
  dbdesc._M_string_length = 0;
  dbdesc.field_2._M_local_buf[0] = '\0';
  util::lowercase((string *)&npc,dbinfo->_M_elems);
  iVar6 = std::__cxx11::string::compare((char *)&npc);
  std::__cxx11::string::~string((string *)&npc);
  if (iVar6 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&q,"SQLite: ",(allocator<char> *)&local_e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&npc,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q,
                   dbinfo->_M_elems + 1);
    std::__cxx11::string::operator=((string *)&dbdesc,(string *)&npc);
    std::__cxx11::string::~string((string *)&npc);
    std::__cxx11::string::~string((string *)&q);
    type = SQLite;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"MySQL: ",&local_e9);
    std::operator+(&local_e8,&local_50,dbinfo->_M_elems + 2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q,&local_e8
                   ,"@");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&npc,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q,
                   dbinfo->_M_elems + 1);
    std::__cxx11::string::operator=((string *)&dbdesc,(string *)&npc);
    std::__cxx11::string::~string((string *)&npc);
    std::__cxx11::string::~string((string *)&q);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_50);
    __lhs = dbinfo->_M_elems + 5;
    bVar5 = std::operator!=(__lhs,"0");
    if (bVar5) {
      bVar5 = std::operator!=(__lhs,"3306");
      if (bVar5) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&npc,":"
                       ,__lhs);
        std::__cxx11::string::append((string *)&dbdesc);
        std::__cxx11::string::~string((string *)&npc);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&npc,"/",
                   dbinfo->_M_elems + 4);
    std::__cxx11::string::append((string *)&dbdesc);
    std::__cxx11::string::~string((string *)&npc);
    type = MySQL;
  }
  Console::Out("Connecting to database (%s)...",dbdesc._M_dataplus._M_p);
  iVar6 = util::to_int(dbinfo->_M_elems + 5);
  Database::Connect(local_90,type,dbinfo->_M_elems + 1,(unsigned_short)iVar6,dbinfo->_M_elems + 2,
                    dbinfo->_M_elems + 3,dbinfo->_M_elems + 4);
  BeginDB(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&q,"DropsFile",(allocator<char> *)&local_e8);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&q);
  util::variant::GetString_abi_cxx11_((string *)&npc,pmVar8);
  Config::Read(local_98,(string *)&npc,false);
  std::__cxx11::string::~string((string *)&npc);
  std::__cxx11::string::~string((string *)&q);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&q,"ShopsFile",(allocator<char> *)&local_e8);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&q);
  util::variant::GetString_abi_cxx11_((string *)&npc,pmVar8);
  Config::Read(local_a0,(string *)&npc,false);
  std::__cxx11::string::~string((string *)&npc);
  std::__cxx11::string::~string((string *)&q);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&q,"ArenasFile",(allocator<char> *)&local_e8);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&q);
  util::variant::GetString_abi_cxx11_((string *)&npc,pmVar8);
  Config::Read(local_a8,(string *)&npc,false);
  std::__cxx11::string::~string((string *)&npc);
  std::__cxx11::string::~string((string *)&q);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&q,"FormulasFile",(allocator<char> *)&local_e8);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&q);
  util::variant::GetString_abi_cxx11_((string *)&npc,pmVar8);
  Config::Read(local_b0,(string *)&npc,false);
  std::__cxx11::string::~string((string *)&npc);
  std::__cxx11::string::~string((string *)&q);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&q,"HomeFile",(allocator<char> *)&local_e8);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&q);
  util::variant::GetString_abi_cxx11_((string *)&npc,pmVar8);
  Config::Read(local_b8,(string *)&npc,false);
  std::__cxx11::string::~string((string *)&npc);
  std::__cxx11::string::~string((string *)&q);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&q,"SkillsFile",(allocator<char> *)&local_e8);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&q);
  util::variant::GetString_abi_cxx11_((string *)&npc,pmVar8);
  Config::Read(local_c0,(string *)&npc,false);
  std::__cxx11::string::~string((string *)&npc);
  std::__cxx11::string::~string((string *)&q);
  UpdateConfig(this);
  LoadHome(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&npc,"AutoSplitPubFiles",(allocator<char> *)&q);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&npc);
  bVar5 = util::variant::GetBool(pmVar8);
  std::__cxx11::string::~string((string *)&npc);
  this_03 = (EIF *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&q,"EIF",(allocator<char> *)&local_e8);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&q);
  util::variant::GetString_abi_cxx11_((string *)&npc,pmVar8);
  EIF::EIF(this_03,(string *)&npc,bVar5);
  this->eif = this_03;
  std::__cxx11::string::~string((string *)&npc);
  std::__cxx11::string::~string((string *)&q);
  this_04 = (ENF *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&q,"ENF",(allocator<char> *)&local_e8);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&q);
  util::variant::GetString_abi_cxx11_((string *)&npc,pmVar8);
  ENF::ENF(this_04,(string *)&npc,bVar5);
  this->enf = this_04;
  std::__cxx11::string::~string((string *)&npc);
  std::__cxx11::string::~string((string *)&q);
  this_05 = (ESF *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&q,"ESF",(allocator<char> *)&local_e8);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&q);
  util::variant::GetString_abi_cxx11_((string *)&npc,pmVar8);
  ESF::ESF(this_05,(string *)&npc,bVar5);
  this->esf = this_05;
  std::__cxx11::string::~string((string *)&npc);
  std::__cxx11::string::~string((string *)&q);
  this_06 = (ECF *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&q,"ECF",(allocator<char> *)&local_e8);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&q);
  util::variant::GetString_abi_cxx11_((string *)&npc,pmVar8);
  ECF::ECF(this_06,(string *)&npc,bVar5);
  this->ecf = this_06;
  std::__cxx11::string::~string((string *)&npc);
  std::__cxx11::string::~string((string *)&q);
  __new_size = ((long)(this->enf->data).
                      super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->enf->data).
                     super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x48;
  std::
  vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ::resize(&this->npc_data,__new_size);
  lVar14 = 0;
  for (sVar13 = 0; __new_size != sVar13; sVar13 = sVar13 + 1) {
    puVar2 = (this->npc_data).
             super__Vector_base<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_07 = (NPC_Data *)operator_new(0xc0);
    NPC_Data::NPC_Data(this_07,this,(short)sVar13);
    std::__uniq_ptr_impl<NPC_Data,_std::default_delete<NPC_Data>_>::reset
              ((__uniq_ptr_impl<NPC_Data,_std::default_delete<NPC_Data>_> *)
               ((long)&(puVar2->_M_t).
                       super___uniq_ptr_impl<NPC_Data,_std::default_delete<NPC_Data>_>._M_t + lVar14
               ),this_07);
    this_02._M_t.super__Tuple_impl<0UL,_NPC_Data_*,_std::default_delete<NPC_Data>_>.
    super__Head_base<0UL,_NPC_Data_*,_false>._M_head_impl =
         puVar2[sVar13]._M_t.super___uniq_ptr_impl<NPC_Data,_std::default_delete<NPC_Data>_>._M_t;
    if (*(short *)this_02._M_t.super__Tuple_impl<0UL,_NPC_Data_*,_std::default_delete<NPC_Data>_>.
                  super__Head_base<0UL,_NPC_Data_*,_false>._M_head_impl != 0) {
      NPC_Data::LoadShopDrop
                ((NPC_Data *)
                 this_02._M_t.super__Tuple_impl<0UL,_NPC_Data_*,_std::default_delete<NPC_Data>_>.
                 super__Head_base<0UL,_NPC_Data_*,_false>._M_head_impl);
    }
    lVar14 = lVar14 + 8;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&npc,"Maps",(allocator<char> *)&q);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&npc);
  iVar6 = util::variant::GetInt(pmVar8);
  std::vector<Map_*,_std::allocator<Map_*>_>::resize(local_c8,(long)iVar6);
  std::__cxx11::string::~string((string *)&npc);
  lVar14 = 0;
  uVar12 = 0;
  while( true ) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&npc,"Maps",(allocator<char> *)&q);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)&npc);
    iVar6 = util::variant::GetInt(pmVar8);
    std::__cxx11::string::~string((string *)&npc);
    if (iVar6 <= lVar14) break;
    this_08 = (Map *)operator_new(0xd8);
    Map::Map(this_08,(int)lVar14 + 1,this);
    (local_c8->super__Vector_base<Map_*,_std::allocator<Map_*>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar14] = this_08;
    uVar12 = uVar12 + (local_c8->super__Vector_base<Map_*,_std::allocator<Map_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar14]->exists;
    lVar14 = lVar14 + 1;
  }
  Console::Out("%i/%i maps loaded.",(ulong)uVar12,
               (ulong)((long)(this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&npc,"Quests",(allocator<char> *)&q);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&npc);
  iVar6 = util::variant::GetInt(pmVar8);
  std::__cxx11::string::~string((string *)&npc);
  pEVar3 = (this->enf->data).
           super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pEVar15 = (this->enf->data).
                 super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>.
                 _M_impl.super__Vector_impl_data._M_start; sVar11 = (short)iVar6, pEVar15 != pEVar3;
      pEVar15 = pEVar15 + 1) {
    ENF_Data_Base<ENF>::ENF_Data_Base(&npc,pEVar15);
    iVar4 = npc._52_4_;
    if (npc.vendor_id < sVar11) {
      iVar4 = iVar6;
    }
    if (npc.type != Quest) {
      iVar4 = iVar6;
    }
    iVar6 = iVar4;
    std::__cxx11::string::~string((string *)&npc.name);
  }
  for (local_e8._M_dataplus._M_p._0_2_ = 0; (short)local_e8._M_dataplus._M_p <= sVar11;
      local_e8._M_dataplus._M_p._0_2_ = (short)local_e8._M_dataplus._M_p + 1) {
    npc._0_8_ = this;
    std::make_shared<Quest,short&,World*>((short *)&q,(World **)&local_e8);
    npc.id._0_2_ = (short)local_e8._M_dataplus._M_p;
    npc.name._M_dataplus._M_p =
         (pointer)q.super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    npc.name._M_string_length =
         (size_type)q.super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    q.super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    q.super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    _Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest>>>>
    ::_M_emplace_unique<std::pair<short,std::shared_ptr<Quest>>>
              (local_80,(pair<short,_std::shared_ptr<Quest>_> *)&npc);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&npc.name._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&q.super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  Console::Out("%i/%i quests loaded.",
               (ulong)(uint)(this->quests)._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (ulong)(uint)(int)sVar11);
  this->last_character_id = 0;
  pTVar9 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(pTVar9,world_spawn_npcs,this,1.0,-1);
  Timer::Register(this_00,pTVar9);
  pTVar9 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(pTVar9,world_act_npcs,this,0.05,-1);
  Timer::Register(this_00,pTVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&npc,"RecoverSpeed",(allocator<char> *)&q);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&npc);
  iVar6 = util::variant::GetInt(pmVar8);
  std::__cxx11::string::~string((string *)&npc);
  if (0 < iVar6) {
    pTVar9 = (TimeEvent *)operator_new(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&npc,"RecoverSpeed",(allocator<char> *)&q);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)&npc);
    dVar16 = util::variant::GetFloat(pmVar8);
    TimeEvent::TimeEvent(pTVar9,world_recover,this,dVar16,-1);
    std::__cxx11::string::~string((string *)&npc);
    Timer::Register(this_00,pTVar9);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&npc,"NPCRecoverSpeed",(allocator<char> *)&q);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&npc);
  iVar6 = util::variant::GetInt(pmVar8);
  std::__cxx11::string::~string((string *)&npc);
  if (0 < iVar6) {
    pTVar9 = (TimeEvent *)operator_new(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&npc,"NPCRecoverSpeed",(allocator<char> *)&q);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)&npc);
    dVar16 = util::variant::GetFloat(pmVar8);
    TimeEvent::TimeEvent(pTVar9,world_npc_recover,this,dVar16,-1);
    std::__cxx11::string::~string((string *)&npc);
    Timer::Register(this_00,pTVar9);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&npc,"WarpSuck",(allocator<char> *)&q);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&npc);
  iVar6 = util::variant::GetInt(pmVar8);
  std::__cxx11::string::~string((string *)&npc);
  if (0 < iVar6) {
    pTVar9 = (TimeEvent *)operator_new(0x30);
    TimeEvent::TimeEvent(pTVar9,world_warp_suck,this,1.0,-1);
    Timer::Register(this_00,pTVar9);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&npc,"ItemDespawn",(allocator<char> *)&q);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&npc);
  bVar5 = util::variant::GetBool(pmVar8);
  std::__cxx11::string::~string((string *)&npc);
  if (bVar5) {
    pTVar9 = (TimeEvent *)operator_new(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&npc,"ItemDespawnCheck",(allocator<char> *)&q);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)&npc);
    dVar16 = util::variant::GetFloat(pmVar8);
    TimeEvent::TimeEvent(pTVar9,world_despawn_items,this,dVar16,-1);
    std::__cxx11::string::~string((string *)&npc);
    Timer::Register(this_00,pTVar9);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&npc,"TimedSave",(allocator<char> *)&q);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&npc);
  bVar5 = util::variant::GetBool(pmVar8);
  std::__cxx11::string::~string((string *)&npc);
  if (bVar5) {
    pTVar9 = (TimeEvent *)operator_new(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&npc,"TimedSave",(allocator<char> *)&q);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)&npc);
    dVar16 = util::variant::GetFloat(pmVar8);
    TimeEvent::TimeEvent(pTVar9,world_timed_save,this,dVar16,-1);
    std::__cxx11::string::~string((string *)&npc);
    Timer::Register(this_00,pTVar9);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&npc,"SpikeTime",(allocator<char> *)&q);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&npc);
  bVar5 = util::variant::GetBool(pmVar8);
  std::__cxx11::string::~string((string *)&npc);
  if (bVar5) {
    pTVar9 = (TimeEvent *)operator_new(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&npc,"SpikeTime",(allocator<char> *)&q);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)&npc);
    dVar16 = util::variant::GetFloat(pmVar8);
    TimeEvent::TimeEvent(pTVar9,world_spikes,this,dVar16,-1);
    std::__cxx11::string::~string((string *)&npc);
    Timer::Register(this_00,pTVar9);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&npc,"DrainTime",(allocator<char> *)&q);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&npc);
  bVar5 = util::variant::GetBool(pmVar8);
  std::__cxx11::string::~string((string *)&npc);
  if (bVar5) {
    pTVar9 = (TimeEvent *)operator_new(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&npc,"DrainTime",(allocator<char> *)&q);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)&npc);
    dVar16 = util::variant::GetFloat(pmVar8);
    TimeEvent::TimeEvent(pTVar9,world_drains,this,dVar16,-1);
    std::__cxx11::string::~string((string *)&npc);
    Timer::Register(this_00,pTVar9);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&npc,"QuakeRate",(allocator<char> *)&q);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)&npc);
  bVar5 = util::variant::GetBool(pmVar8);
  std::__cxx11::string::~string((string *)&npc);
  if (bVar5) {
    pTVar9 = (TimeEvent *)operator_new(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&npc,"QuakeRate",(allocator<char> *)&q);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)&npc);
    dVar16 = util::variant::GetFloat(pmVar8);
    TimeEvent::TimeEvent(pTVar9,world_quakes,this,dVar16,-1);
    std::__cxx11::string::~string((string *)&npc);
    Timer::Register(this_00,pTVar9);
  }
  (this->exp_table)._M_elems[0] = 0;
  for (lVar14 = 0x15b; lVar14 != 600; lVar14 = lVar14 + 1) {
    dVar16 = pow((double)(lVar14 + -0x15a),3.0);
    dVar16 = util::round(dVar16 * 133.1);
    (&this->last_character_id)[lVar14] = (int)dVar16;
  }
  for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
    pBVar10 = (Board *)operator_new(0x20);
    pBVar10->id = (int)lVar14;
    pBVar10->last_id = 0;
    *(list<Board_Post_*,_std::allocator<Board_Post_*>_> **)
     ((long)&(pBVar10->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl.
             _M_node.super__List_node_base + 8) = &pBVar10->posts;
    (pBVar10->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&pBVar10->posts;
    (pBVar10->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl._M_node.
    _M_size = 0;
    (this->boards)._M_elems[lVar14] = pBVar10;
  }
  this_09 = (GuildManager *)operator_new(0x80);
  GuildManager::GuildManager(this_09,this);
  this->guildmanager = this_09;
  std::__cxx11::string::~string((string *)&dbdesc);
  return;
}

Assistant:

World::World(std::array<std::string, 6> dbinfo, const Config &eoserv_config, const Config &admin_config)
	: i18n(eoserv_config.find("ServerLanguage")->second)
	, admin_count(0)
{
	if (int(this->timer.resolution * 1000.0) > 1)
	{
		Console::Out("Timers set at approx. %i ms resolution", int(this->timer.resolution * 1000.0));
	}
	else
	{
		Console::Out("Timers set at < 1 ms resolution");
	}

	this->config = eoserv_config;
	this->admin_config = admin_config;

	Database::Engine engine;

	std::string dbdesc;

	if (util::lowercase(dbinfo[0]).compare("sqlite") == 0)
	{
		engine = Database::SQLite;
		dbdesc = std::string("SQLite: ")
		       + dbinfo[1];
	}
	else
	{
		engine = Database::MySQL;
		dbdesc = std::string("MySQL: ")
		       + dbinfo[2] + "@"
		       + dbinfo[1];

		if (dbinfo[5] != "0" && dbinfo[5] != "3306")
			dbdesc += ":" + dbinfo[5];

		dbdesc += "/" + dbinfo[4];
	}

	Console::Out("Connecting to database (%s)...", dbdesc.c_str());
	this->db.Connect(engine, dbinfo[1], util::to_int(dbinfo[5]), dbinfo[2], dbinfo[3], dbinfo[4]);
	this->BeginDB();

	this->drops_config.Read(this->config["DropsFile"]);
	this->shops_config.Read(this->config["ShopsFile"]);
	this->arenas_config.Read(this->config["ArenasFile"]);
	this->formulas_config.Read(this->config["FormulasFile"]);
	this->home_config.Read(this->config["HomeFile"]);
	this->skills_config.Read(this->config["SkillsFile"]);

	this->UpdateConfig();
	this->LoadHome();

	bool auto_split = this->config["AutoSplitPubFiles"];

	this->eif = new EIF(this->config["EIF"], auto_split);
	this->enf = new ENF(this->config["ENF"], auto_split);
	this->esf = new ESF(this->config["ESF"], auto_split);
	this->ecf = new ECF(this->config["ECF"], auto_split);

	std::size_t num_npcs = this->enf->data.size();
	this->npc_data.resize(num_npcs);
	for (std::size_t i = 0; i < num_npcs; ++i)
	{
		auto& npc = this->npc_data[i];
		npc.reset(new NPC_Data(this, i));
		if (npc->id != 0)
			npc->LoadShopDrop();
	}

	this->maps.resize(static_cast<int>(this->config["Maps"]));
	int loaded = 0;
	for (int i = 0; i < static_cast<int>(this->config["Maps"]); ++i)
	{
		this->maps[i] = new Map(i + 1, this);
		if (this->maps[i]->exists)
			++loaded;
	}
	Console::Out("%i/%i maps loaded.", loaded, static_cast<int>(this->maps.size()));

	short max_quest = static_cast<int>(this->config["Quests"]);

	UTIL_FOREACH(this->enf->data, npc)
	{
		if (npc.type == ENF::Quest)
			max_quest = std::max(max_quest, npc.vendor_id);
	}

	for (short i = 0; i <= max_quest; ++i)
	{
		try
		{
			std::shared_ptr<Quest> q = std::make_shared<Quest>(i, this);
			this->quests.insert(std::make_pair(i, std::move(q)));
		}
		catch (...)
		{

		}
	}
	Console::Out("%i/%i quests loaded.", static_cast<int>(this->quests.size()), max_quest);

	this->last_character_id = 0;

	TimeEvent *event = new TimeEvent(world_spawn_npcs, this, 1.0, Timer::FOREVER);
	this->timer.Register(event);

	event = new TimeEvent(world_act_npcs, this, 0.05, Timer::FOREVER);
	this->timer.Register(event);

	if (int(this->config["RecoverSpeed"]) > 0)
	{
		event = new TimeEvent(world_recover, this, double(this->config["RecoverSpeed"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (int(this->config["NPCRecoverSpeed"]) > 0)
	{
		event = new TimeEvent(world_npc_recover, this, double(this->config["NPCRecoverSpeed"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (int(this->config["WarpSuck"]) > 0)
	{
		event = new TimeEvent(world_warp_suck, this, 1.0, Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["ItemDespawn"])
	{
		event = new TimeEvent(world_despawn_items, this, static_cast<double>(this->config["ItemDespawnCheck"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["TimedSave"])
	{
		event = new TimeEvent(world_timed_save, this, static_cast<double>(this->config["TimedSave"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["SpikeTime"])
	{
		event = new TimeEvent(world_spikes, this, static_cast<double>(this->config["SpikeTime"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["DrainTime"])
	{
		event = new TimeEvent(world_drains, this, static_cast<double>(this->config["DrainTime"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["QuakeRate"])
	{
		event = new TimeEvent(world_quakes, this, static_cast<double>(this->config["QuakeRate"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	exp_table[0] = 0;
	for (std::size_t i = 1; i < this->exp_table.size(); ++i)
	{
		exp_table[i] = int(util::round(std::pow(double(i), 3.0) * 133.1));
	}

	for (std::size_t i = 0; i < this->boards.size(); ++i)
	{
		this->boards[i] = new Board(i);
	}

	this->guildmanager = new GuildManager(this);
}